

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

int __thiscall QApplicationPrivate::init(QApplicationPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QApplicationPrivate *this_00;
  
  QGuiApplicationPrivate::init();
  qInitResources_qstyle();
  qInitResources_qmessagebox();
  qt_is_tty_app = this->field_0x90 == '\0';
  this_00 = this;
  process_cmdline(this);
  QColormap::initialize();
  initializeWidgetPalettesFromTheme();
  qt_init_tooltip_palette();
  initializeWidgetFontHash(this_00);
  initialize(this);
  (**(code **)(*QCoreApplicationPrivate::eventDispatcher + 0xb0))();
  iVar1 = QAccessible::installFactory(qAccessibleFactory);
  return iVar1;
}

Assistant:

void QApplicationPrivate::init()
{
#if defined(Q_OS_MACOS)
    QMacAutoReleasePool pool;
#endif

    QGuiApplicationPrivate::init();

    initResources();

    qt_is_tty_app = (application_type == QApplicationPrivate::Tty);
    process_cmdline();

    // Must be called before initialize()
    QColormap::initialize();
    initializeWidgetPalettesFromTheme();
    qt_init_tooltip_palette();
    QApplicationPrivate::initializeWidgetFontHash();

    initialize();
    eventDispatcher->startingUp();

#if QT_CONFIG(accessibility)
    // factory for accessible interfaces for widgets shipped with Qt
    QAccessible::installFactory(&qAccessibleFactory);
#endif

}